

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SRes Bcj2Dec_Decode(CBcj2Dec *p)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  UInt32 UVar4;
  uint uVar5;
  uint *puVar6;
  int *piVar7;
  short sVar8;
  uint uVar9;
  UInt32 UVar10;
  byte *pbVar11;
  ulong uVar12;
  byte *pbVar13;
  UInt32 _vvv_;
  int iVar14;
  byte *pbVar15;
  long lVar16;
  ulong uVar17;
  Byte *pBVar18;
  bool bVar19;
  
  if (5 < p->range) {
    if (3 < p->state) {
      uVar9 = p->state;
      while (uVar9 < 8) {
        pBVar18 = p->dest;
        if (pBVar18 == p->destLim) {
          return 0;
        }
        p->state = uVar9 + 1;
        *pBVar18 = p->temp[uVar9 - 4];
        p->dest = pBVar18 + 1;
        uVar9 = p->state;
      }
    }
LAB_001120fe:
    do {
      while (p->state - 1 < 2) {
        p->state = 9;
LAB_001122c8:
        uVar9 = (p->temp[3] != 0xe8) + 1;
        puVar6 = (uint *)p->bufs[uVar9];
        if (puVar6 == (uint *)p->lims[uVar9]) goto LAB_00112359;
        uVar5 = *puVar6;
        p->bufs[uVar9] = (Byte *)(puVar6 + 1);
        UVar10 = p->ip + 4;
        p->ip = UVar10;
        iVar14 = (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18) -
                 UVar10;
        piVar7 = (int *)p->dest;
        uVar12 = (long)p->destLim - (long)piVar7;
        if (uVar12 < 4) {
          *(int *)p->temp = iVar14;
          if ((int *)p->destLim != piVar7) {
            lVar16 = 0;
            do {
              *(Byte *)((long)piVar7 + lVar16) = p->temp[lVar16];
              lVar16 = lVar16 + 1;
            } while (uVar12 + (uVar12 == 0) != lVar16);
          }
          p->dest = (Byte *)((long)piVar7 + uVar12);
          uVar9 = (uint)uVar12 | 4;
LAB_00112359:
          p->state = uVar9;
          if (0xffffff < p->range) {
            return 0;
          }
          pbVar11 = p->bufs[3];
          if (pbVar11 == p->lims[3]) {
            return 0;
          }
          p->range = p->range << 8;
          UVar10 = p->code;
          p->bufs[3] = pbVar11 + 1;
          p->code = (uint)*pbVar11 | UVar10 << 8;
          return 0;
        }
        *piVar7 = iVar14;
        p->temp[3] = (Byte)((uint)iVar14 >> 0x18);
        p->dest = (Byte *)(piVar7 + 1);
      }
      if (p->range < 0x1000000) {
        pbVar11 = p->bufs[3];
        if (pbVar11 == p->lims[3]) goto LAB_0011231f;
        p->range = p->range << 8;
        UVar10 = p->code;
        p->bufs[3] = pbVar11 + 1;
        p->code = (uint)*pbVar11 | UVar10 << 8;
      }
      pbVar11 = p->bufs[0];
      uVar12 = (long)p->lims[0] - (long)pbVar11;
      if (uVar12 == 0) {
        p->state = 0;
LAB_001122b4:
        iVar14 = 1;
      }
      else {
        pbVar15 = p->dest;
        uVar17 = (long)p->destLim - (long)pbVar15;
        if ((uVar17 < uVar12) && (uVar12 = uVar17, uVar17 == 0)) {
          p->state = 8;
          goto LAB_001122b4;
        }
        pbVar13 = pbVar11 + uVar12;
        do {
          bVar1 = *pbVar11;
          *pbVar15 = bVar1;
          if (bVar1 == 0xf) {
            pbVar15 = pbVar15 + 1;
            pbVar11 = pbVar11 + 1;
            bVar19 = true;
            if (pbVar11 != pbVar13) {
              bVar19 = false;
            }
          }
          else {
            bVar19 = true;
            if ((bVar1 & 0xfe) != 0xe8) {
              pbVar15 = pbVar15 + 1;
              pbVar11 = pbVar11 + 1;
              bVar19 = pbVar11 == pbVar13;
            }
          }
        } while (!bVar19);
        lVar16 = (long)pbVar11 - (long)p->bufs[0];
        if (pbVar11 == pbVar13) {
          pbVar15 = p->lims[0];
          p->temp[3] = pbVar11[-1];
          p->bufs[0] = pbVar11;
          p->ip = p->ip + (int)lVar16;
          p->dest = p->dest + lVar16;
          p->state = (uint)(pbVar11 != pbVar15) << 3;
          goto LAB_001122b4;
        }
        bVar1 = *pbVar11;
        pBVar18 = pbVar11 + -1;
        if (pbVar11 == p->bufs[0]) {
          pBVar18 = p->temp + 3;
        }
        bVar2 = *pBVar18;
        p->temp[3] = bVar1;
        p->bufs[0] = pbVar11 + 1;
        p->ip = p->ip + (int)(lVar16 + 1);
        p->dest = p->dest + lVar16 + 1;
        uVar12 = (ulong)(bVar1 == 0xe9);
        if (bVar1 == 0xe8) {
          uVar12 = (ulong)bVar2 + 2;
        }
        uVar3 = p->probs[uVar12];
        uVar9 = (p->range >> 0xb) * (uint)uVar3;
        if (p->code < uVar9) {
          p->range = uVar9;
          sVar8 = (short)(0x800 - uVar3 >> 5);
          iVar14 = 8;
        }
        else {
          p->range = p->range - uVar9;
          p->code = p->code - uVar9;
          sVar8 = -(uVar3 >> 5);
          iVar14 = 0;
        }
        p->probs[uVar12] = sVar8 + uVar3;
      }
      if (iVar14 == 0) goto LAB_001122c8;
      if (iVar14 != 8) {
        return 0;
      }
    } while( true );
  }
  p->state = 9;
  UVar10 = p->range;
  while( true ) {
    if (UVar10 == 1) {
      if (p->code != 0) {
        return 1;
      }
    }
    else if (UVar10 == 5) {
      if (p->code == 0xffffffff) {
        return 1;
      }
      p->range = 0xffffffff;
      goto LAB_001120fe;
    }
    pbVar11 = p->bufs[3];
    if (pbVar11 == p->lims[3]) break;
    UVar4 = p->code;
    p->bufs[3] = pbVar11 + 1;
    p->code = (uint)*pbVar11 | UVar4 << 8;
    UVar10 = UVar10 + 1;
    p->range = UVar10;
  }
LAB_0011231f:
  p->state = 3;
  return 0;
}

Assistant:

static SRes Bcj2Dec_Decode(CBcj2Dec *p)
{
  if (p->range <= 5)
  {
    p->state = BCJ2_DEC_STATE_OK;
    for (; p->range != 5; p->range++)
    {
      if (p->range == 1 && p->code != 0)
        return SZ_ERROR_DATA;
      
      if (p->bufs[BCJ2_STREAM_RC] == p->lims[BCJ2_STREAM_RC])
      {
        p->state = BCJ2_STREAM_RC;
        return SZ_OK;
      }

      p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
    }
    
    if (p->code == 0xFFFFFFFF)
      return SZ_ERROR_DATA;
    
    p->range = 0xFFFFFFFF;
  }
  else if (p->state >= BCJ2_DEC_STATE_ORIG_0)
  {
    while (p->state <= BCJ2_DEC_STATE_ORIG_3)
    {
      Byte *dest = p->dest;
      if (dest == p->destLim)
        return SZ_OK;
      *dest = p->temp[p->state++ - BCJ2_DEC_STATE_ORIG_0];
      p->dest = dest + 1;
    }
  }

  /*
  if (BCJ2_IS_32BIT_STREAM(p->state))
  {
    const Byte *cur = p->bufs[p->state];
    if (cur == p->lims[p->state])
      return SZ_OK;
    p->bufs[p->state] = cur + 4;
    
    {
      UInt32 val;
      Byte *dest;
      SizeT rem;
      
      p->ip += 4;
      val = GetBe32(cur) - p->ip;
      dest = p->dest;
      rem = p->destLim - dest;
      if (rem < 4)
      {
        SizeT i;
        SetUi32(p->temp, val);
        for (i = 0; i < rem; i++)
          dest[i] = p->temp[i];
        p->dest = dest + rem;
        p->state = BCJ2_DEC_STATE_ORIG_0 + (unsigned)rem;
        return SZ_OK;
      }
      SetUi32(dest, val);
      p->temp[3] = (Byte)(val >> 24);
      p->dest = dest + 4;
      p->state = BCJ2_DEC_STATE_OK;
    }
  }
  */

  for (;;)
  {
    if (BCJ2_IS_32BIT_STREAM(p->state))
      p->state = BCJ2_DEC_STATE_OK;
    else
    {
      if (p->range < kTopValue)
      {
        if (p->bufs[BCJ2_STREAM_RC] == p->lims[BCJ2_STREAM_RC])
        {
          p->state = BCJ2_STREAM_RC;
          return SZ_OK;
        }
        p->range <<= 8;
        p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
      }

      {
        const Byte *src = p->bufs[BCJ2_STREAM_MAIN];
        const Byte *srcLim;
        Byte *dest;
        SizeT num = p->lims[BCJ2_STREAM_MAIN] - src;
        
        if (num == 0)
        {
          p->state = BCJ2_STREAM_MAIN;
          return SZ_OK;
        }
        
        dest = p->dest;
        if (num > (SizeT)(p->destLim - dest))
        {
          num = p->destLim - dest;
          if (num == 0)
          {
            p->state = BCJ2_DEC_STATE_ORIG;
            return SZ_OK;
          }
        }
       
        srcLim = src + num;

        if (p->temp[3] == 0x0F && (src[0] & 0xF0) == 0x80)
          *dest = src[0];
        else for (;;)
        {
          Byte b = *src;
          *dest = b;
          if (b != 0x0F)
          {
            if ((b & 0xFE) == 0xE8)
              break;
            dest++;
            if (++src != srcLim)
              continue;
            break;
          }
          dest++;
          if (++src == srcLim)
            break;
          if ((*src & 0xF0) != 0x80)
            continue;
          *dest = *src;
          break;
        }
        
        num = src - p->bufs[BCJ2_STREAM_MAIN];
        
        if (src == srcLim)
        {
          p->temp[3] = src[-1];
          p->bufs[BCJ2_STREAM_MAIN] = src;
          p->ip += (UInt32)num;
          p->dest += num;
          p->state =
            p->bufs[BCJ2_STREAM_MAIN] ==
            p->lims[BCJ2_STREAM_MAIN] ?
              (unsigned)BCJ2_STREAM_MAIN :
              (unsigned)BCJ2_DEC_STATE_ORIG;
          return SZ_OK;
        }
        
        {
          UInt32 bound, ttt;
          CProb *prob;
          Byte b = src[0];
          Byte prev = (Byte)(num == 0 ? p->temp[3] : src[-1]);
          
          p->temp[3] = b;
          p->bufs[BCJ2_STREAM_MAIN] = src + 1;
          num++;
          p->ip += (UInt32)num;
          p->dest += num;
          
          prob = p->probs + (unsigned)(b == 0xE8 ? 2 + (unsigned)prev : (b == 0xE9 ? 1 : 0));
          
          _IF_BIT_0
          {
            _UPDATE_0
            continue;
          }
          _UPDATE_1
            
        }
      }
    }

    {
      UInt32 val;
      unsigned cj = (p->temp[3] == 0xE8) ? BCJ2_STREAM_CALL : BCJ2_STREAM_JUMP;
      const Byte *cur = p->bufs[cj];
      Byte *dest;
      SizeT rem;
      
      if (cur == p->lims[cj])
      {
        p->state = cj;
        break;
      }
      
      val = GetBe32(cur);
      p->bufs[cj] = cur + 4;

      p->ip += 4;
      val -= p->ip;
      dest = p->dest;
      rem = p->destLim - dest;
      
      if (rem < 4)
      {
        SizeT i;
        SetUi32(p->temp, val);
        for (i = 0; i < rem; i++)
          dest[i] = p->temp[i];
        p->dest = dest + rem;
        p->state = BCJ2_DEC_STATE_ORIG_0 + (unsigned)rem;
        break;
      }
      
      SetUi32(dest, val);
      p->temp[3] = (Byte)(val >> 24);
      p->dest = dest + 4;
    }
  }

  if (p->range < kTopValue && p->bufs[BCJ2_STREAM_RC] != p->lims[BCJ2_STREAM_RC])
  {
    p->range <<= 8;
    p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
  }

  return SZ_OK;
}